

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  MessageLite *pMVar4;
  LogFinisher local_51;
  LogMessage local_50;
  Extension *extension;
  
  bVar1 = MaybeNewExtension(this,number,descriptor,&extension);
  if (bVar1) {
    extension->type = type;
    CVar2 = anon_unknown_0::cpp_type(type);
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x18a);
      pLVar3 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_51,pLVar3);
      LogMessage::~LogMessage(&local_50);
    }
    extension->is_repeated = false;
    pMVar4 = (MessageLite *)operator_new(0x20);
    pMVar4->_vptr_MessageLite = (_func_int **)(pMVar4 + 2);
    pMVar4[1]._vptr_MessageLite = (_func_int **)0x0;
    *(undefined1 *)&pMVar4[2]._vptr_MessageLite = 0;
    (extension->field_0).message_value = pMVar4;
  }
  else {
    if (extension->is_repeated != false) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x18e);
      pLVar3 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=(&local_51,pLVar3);
      LogMessage::~LogMessage(&local_50);
    }
    CVar2 = anon_unknown_0::cpp_type(extension->type);
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x18e);
      pLVar3 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_51,pLVar3);
      LogMessage::~LogMessage(&local_50);
    }
  }
  extension->field_0xa = extension->field_0xa & 0xf0;
  return (string *)(extension->field_0).int64_value;
}

Assistant:

string* ExtensionSet::MutableString(int number, FieldType type,
                                    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->string_value = new string;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, STRING);
  }
  extension->is_cleared = false;
  return extension->string_value;
}